

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmimedatabase.cpp
# Opt level: O2

QMimeType __thiscall
QMimeDatabasePrivate::mimeTypeForFileNameAndData
          (QMimeDatabasePrivate *this,QString *fileName,QIODevice *device)

{
  bool bVar1;
  long in_RCX;
  QMimeType *mime;
  long in_FS_OFFSET;
  QMimeGlobMatchResult candidatesByName;
  QFile local_e8;
  QMimeGlobMatchResult local_d8;
  undefined1 local_88 [56];
  undefined1 *puStack_50;
  undefined1 *local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  local_88._48_8_ = &DAT_aaaaaaaaaaaaaaaa;
  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  local_88._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_88._40_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_88._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_88._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_88._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_88._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  findByFileName((QMimeGlobMatchResult *)local_88,(QMimeDatabasePrivate *)fileName,(QString *)device
                );
  if ((undefined1 *)local_88._40_8_ == (undefined1 *)0x1) {
    (this->m_defaultMimeType).d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    mimeTypeForName(this,fileName);
    bVar1 = QMimeType::isValid((QMimeType *)this);
    if (bVar1) goto LAB_00442557;
    local_d8.m_allMatchingMimeTypes.d.ptr = (QString *)0x0;
    local_d8.m_allMatchingMimeTypes.d.size = 0;
    local_d8.m_matchingMimeTypes.d.size = 0;
    local_d8.m_allMatchingMimeTypes.d.d = (Data *)0x0;
    local_d8.m_matchingMimeTypes.d.d = (Data *)0x0;
    local_d8.m_matchingMimeTypes.d.ptr = (QString *)0x0;
    local_d8.m_weight = 0;
    local_d8.m_matchingPatternLength = 0;
    local_d8.m_knownSuffixLength = 0;
    QMimeGlobMatchResult::operator=((QMimeGlobMatchResult *)local_88,&local_d8);
    QMimeGlobMatchResult::~QMimeGlobMatchResult(&local_d8);
    QMimeType::~QMimeType((QMimeType *)this);
  }
  local_d8.m_matchingMimeTypes.d.d = (Data *)fileName;
  local_d8.m_matchingMimeTypes.d.ptr = (QString *)local_88;
  if (in_RCX == 0) {
    local_e8.super_QFileDevice.super_QIODevice.super_QObject._vptr_QObject =
         (_func_int **)&DAT_aaaaaaaaaaaaaaaa;
    local_e8.super_QFileDevice.super_QIODevice.super_QObject.d_ptr.d =
         (QObjectData *)&DAT_aaaaaaaaaaaaaaaa;
    QFile::QFile(&local_e8,(QString *)device);
    mimeTypeForFileNameAndData::anon_class_16_2_b95a222d::operator()
              ((anon_class_16_2_b95a222d *)this,(QIODevice *)&local_d8);
    QFile::~QFile(&local_e8);
  }
  else {
    mimeTypeForFileNameAndData::anon_class_16_2_b95a222d::operator()
              ((anon_class_16_2_b95a222d *)this,(QIODevice *)&local_d8);
  }
LAB_00442557:
  QMimeGlobMatchResult::~QMimeGlobMatchResult((QMimeGlobMatchResult *)local_88);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (QExplicitlySharedDataPointer<QMimeTypePrivate>)
           (QExplicitlySharedDataPointer<QMimeTypePrivate>)this;
  }
  __stack_chk_fail();
}

Assistant:

QMimeType QMimeDatabasePrivate::mimeTypeForFileNameAndData(const QString &fileName, QIODevice *device)
{
    // First, glob patterns are evaluated. If there is a match with max weight,
    // this one is selected and we are done. Otherwise, the file contents are
    // evaluated and the match with the highest value (either a magic priority or
    // a glob pattern weight) is selected. Matching starts from max level (most
    // specific) in both cases, even when there is already a suffix matching candidate.

    // Pass 1) Try to match on the file name
    QMimeGlobMatchResult candidatesByName = findByFileName(fileName);
    if (candidatesByName.m_allMatchingMimeTypes.size() == 1) {
        const QMimeType mime = mimeTypeForName(candidatesByName.m_matchingMimeTypes.at(0));
        if (mime.isValid())
            return mime;
        candidatesByName = {};
    }

    // Extension is unknown, or matches multiple mimetypes.
    // Pass 2) Match on content, if we can read the data
    const auto matchOnContent = [this, &candidatesByName](QIODevice *device) {
        const bool openedByUs = !device->isOpen() && device->open(QIODevice::ReadOnly);
        if (device->isOpen()) {
            // Read 16K in one go (QIODEVICE_BUFFERSIZE in qiodevice_p.h).
            // This is much faster than seeking back and forth into QIODevice.
            const QByteArray data = device->peek(16384);

            if (openedByUs)
                device->close();

            int magicAccuracy = 0;
            QMimeType candidateByData(findByData(data, &magicAccuracy));

            // Disambiguate conflicting extensions (if magic matching found something)
            if (candidateByData.isValid() && magicAccuracy > 0) {
                const QString sniffedMime = candidateByData.name();
                // If the sniffedMime matches a highest-weight glob match, use it
                if (candidatesByName.m_matchingMimeTypes.contains(sniffedMime)) {
                    return candidateByData;
                }
                for (const QString &m : std::as_const(candidatesByName.m_allMatchingMimeTypes)) {
                    if (inherits(m, sniffedMime)) {
                        // We have magic + pattern pointing to this, so it's a pretty good match
                        return mimeTypeForName(m);
                    }
                }
                if (candidatesByName.m_allMatchingMimeTypes.isEmpty()) {
                    // No glob, use magic
                    return candidateByData;
                }
            }
        }

        if (candidatesByName.m_allMatchingMimeTypes.size() > 1) {
            candidatesByName.m_matchingMimeTypes.sort(); // make it deterministic
            const QMimeType mime = mimeTypeForName(candidatesByName.m_matchingMimeTypes.at(0));
            if (mime.isValid())
                return mime;
        }

        return mimeTypeForName(defaultMimeType());
    };

    if (device)
        return matchOnContent(device);

    QFile fallbackFile(fileName);
    return matchOnContent(&fallbackFile);
}